

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

bool __thiscall QGuiApplicationPrivate::lastWindowClosed(QGuiApplicationPrivate *this)

{
  bool bVar1;
  iterator o;
  QWindowPrivate *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QWindowPrivate *windowPrivate;
  QWindow *window;
  QWindowList *__range1;
  iterator __end1;
  iterator __begin1;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  int local_54;
  byte local_39;
  iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::topLevelWindows();
  local_28[0].i = (QWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_28[0] = QList<QWindow_*>::begin
                          ((QList<QWindow_*> *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  o = QList<QWindow_*>::end
                ((QList<QWindow_*> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  do {
    bVar1 = QList<QWindow_*>::iterator::operator!=(local_28,o);
    if (!bVar1) {
      local_54 = 2;
LAB_0036d82e:
      QList<QWindow_*>::~QList((QList<QWindow_*> *)0x36d838);
      if (local_54 != 1) {
        local_39 = 1;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (bool)(local_39 & 1);
    }
    QList<QWindow_*>::iterator::operator*(local_28);
    pQVar2 = qt_window_private((QWindow *)0x36d7e7);
    uVar3 = (**(code **)(*(long *)pQVar2 + 0x50))();
    if (((uVar3 & 1) != 0) && (uVar3 = (**(code **)(*(long *)pQVar2 + 0x58))(), (uVar3 & 1) != 0)) {
      local_39 = 0;
      local_54 = 1;
      goto LAB_0036d82e;
    }
    QList<QWindow_*>::iterator::operator++(local_28);
  } while( true );
}

Assistant:

bool QGuiApplicationPrivate::lastWindowClosed() const
{
    for (auto *window : QGuiApplication::topLevelWindows()) {
        auto *windowPrivate = qt_window_private(window);
        if (!windowPrivate->participatesInLastWindowClosed())
            continue;

        if (windowPrivate->treatAsVisible())
            return false;
     }

     return true;
}